

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::Exception::wrapContext(Exception *this,char *file,int line,String *description)

{
  Disposer *local_48;
  Context *pCStack_40;
  Own<kj::Exception::Context,_std::nullptr_t> local_38;
  int local_1c;
  char *local_18;
  
  local_1c = line;
  local_18 = file;
  heap<kj::Exception::Context,char_const*&,int&,kj::String,kj::Maybe<kj::Own<kj::Exception::Context,decltype(nullptr)>>>
            ((kj *)&local_48,&local_18,&local_1c,description,&this->context);
  local_38.disposer = local_48;
  local_38.ptr = pCStack_40;
  pCStack_40 = (Context *)0x0;
  Own<kj::Exception::Context,_std::nullptr_t>::operator=(&(this->context).ptr,&local_38);
  if (local_38.ptr != (Context *)0x0) {
    local_38.ptr = (Context *)0x0;
    (**(local_38.disposer)->_vptr_Disposer)();
  }
  if (pCStack_40 != (Context *)0x0) {
    pCStack_40 = (Context *)0x0;
    (**local_48->_vptr_Disposer)();
  }
  return;
}

Assistant:

void Exception::wrapContext(const char* file, int line, String&& description) {
  context = heap<Context>(file, line, mv(description), mv(context));
}